

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScheduledReporter.cc
# Opt level: O0

void __thiscall cppmetrics::ScheduledReporter::start(ScheduledReporter *this)

{
  type local_30;
  thread local_28;
  undefined1 local_20 [8];
  unique_lock<std::mutex> lock;
  ScheduledReporter *this_local;
  
  lock._8_8_ = this;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_20,&this->m_mutex);
  if ((this->m_is_running & 1U) == 0) {
    this->m_is_running = true;
    local_30.this = this;
    std::thread::thread<cppmetrics::ScheduledReporter::start()::__0,,void>(&local_28,&local_30);
    std::thread::operator=(&this->m_reporter_thread,&local_28);
    std::thread::~thread(&local_28);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_20);
  return;
}

Assistant:

void ScheduledReporter::start()
{
  std::unique_lock<std::mutex> lock(m_mutex);
  if (!m_is_running)
  {
    m_is_running = true;
    m_reporter_thread = std::thread([&]() {
      loop_while_running();
    });
  }
}